

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

void CVmRun::set_local_in_frame
               (vm_val_t *val,vm_val_t *fp,int varnum,int is_param,int is_ctx_local,int ctx_arr_idx)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_val_t idxval;
  
  if (is_param != 0) {
    uVar2 = *(undefined4 *)&val->field_0x4;
    aVar1 = val->val;
    pvVar3 = fp + (long)(-0xb - varnum) + -1;
    pvVar3->typ = val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    return;
  }
  pvVar3 = fp + varnum;
  if (is_ctx_local != 0) {
    idxval.typ = VM_INT;
    idxval.val.intval = ctx_arr_idx;
    set_index(pvVar3,&idxval,val);
    return;
  }
  uVar2 = *(undefined4 *)&val->field_0x4;
  aVar1 = val->val;
  pvVar3->typ = val->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  return;
}

Assistant:

void CVmRun::set_local_in_frame(VMG_ const vm_val_t *val, vm_val_t *fp,
                                int varnum, int is_param,
                                int is_ctx_local, int ctx_arr_idx)
{
    /* check which kind of variable we have */
    if (is_param)
    {
        /* parameter - get it from the frame */
        *get_param_from_frame(vmg_ fp, varnum) = *val;
    }
    else if (is_ctx_local)
    {
        /* context local - get the context local */
        vm_val_t *cl = get_local_from_frame(vmg_ fp, varnum);

        /* index it to set the local */
        vm_val_t idxval;
        idxval.set_int(ctx_arr_idx);
        set_index(vmg_ cl, &idxval, val);
    }
    else
    {
        /* regular local - set it in the frame */
        *get_local_from_frame(vmg_ fp, varnum) = *val;
    }
}